

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_forward_seqnum(void)

{
  fdb_encryption_key *fconfig_00;
  uint64_t handle;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_doc *metalen;
  fdb_kvs_handle *handle_00;
  fdb_kvs_handle *doc;
  fdb_kvs_info *info_00;
  fdb_doc *pfVar6;
  fdb_doc *doc_00;
  fdb_config *fconfig_01;
  fdb_seqnum_t fVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  fdb_kvs_handle **ppfVar12;
  fdb_iterator *pfVar13;
  ulong uVar14;
  fdb_doc **ppfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  uint64_t *puVar18;
  fdb_doc **doc_01;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  long lVar19;
  void *pvVar20;
  char *pcVar21;
  fdb_kvs_handle *kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_kvs_handle *mirror_kv1;
  char setop [3];
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_iterator *pfStack_1a80;
  fdb_doc *pfStack_1a78;
  fdb_kvs_handle *pfStack_1a70;
  timeval tStack_1a68;
  char acStack_1a58 [256];
  char acStack_1958 [264];
  fdb_kvs_handle *pfStack_1850;
  fdb_kvs_handle *pfStack_1848;
  fdb_kvs_handle *pfStack_1840;
  fdb_kvs_config *pfStack_1838;
  fdb_kvs_handle *pfStack_1830;
  fdb_kvs_handle *pfStack_1828;
  fdb_kvs_handle *pfStack_1818;
  fdb_custom_cmp_variable p_Stack_1810;
  fdb_kvs_handle *pfStack_1808;
  fdb_kvs_handle *pfStack_1800;
  fdb_kvs_handle *pfStack_17f8;
  kvs_ops_stat *pkStack_17f0;
  hbtrie *phStack_17e8;
  hbtrie *phStack_17e0;
  fdb_kvs_config fStack_17d8;
  timeval tStack_17c0;
  undefined1 auStack_17b0 [512];
  fdb_config fStack_15b0;
  fdb_kvs_handle *pfStack_14b8;
  fdb_kvs_handle *pfStack_14b0;
  fdb_kvs_handle *pfStack_14a8;
  fdb_kvs_handle *pfStack_14a0;
  fdb_kvs_handle *pfStack_1498;
  fdb_kvs_handle *pfStack_1490;
  undefined1 auStack_1478 [16];
  fdb_kvs_handle *pfStack_1468;
  fdb_file_handle *pfStack_1460;
  undefined1 auStack_1458 [40];
  undefined1 auStack_1430 [280];
  undefined1 auStack_1318 [336];
  timeval tStack_11c8;
  fdb_kvs_handle fStack_11b8;
  fdb_kvs_handle *pfStack_fb0;
  ulong uStack_fa8;
  fdb_kvs_handle **ppfStack_fa0;
  fdb_kvs_handle *pfStack_f98;
  fdb_kvs_handle *pfStack_f88;
  fdb_file_handle *pfStack_f80;
  fdb_kvs_handle *pfStack_f78;
  undefined1 auStack_f70 [64];
  fdb_kvs_config fStack_f30;
  fdb_config fStack_f18;
  char acStack_e20 [264];
  fdb_config *pfStack_d18;
  fdb_doc **ppfStack_d10;
  size_t sStack_d08;
  fdb_doc **ppfStack_d00;
  void *pvStack_cf8;
  fdb_doc *pfStack_cf0;
  fdb_kvs_handle *pfStack_ce0;
  fdb_file_handle *pfStack_cd8;
  fdb_kvs_handle *pfStack_cd0;
  size_t sStack_cc8;
  void *pvStack_cc0;
  fdb_kvs_info fStack_cb8;
  fdb_kvs_config fStack_c88;
  timeval tStack_c70;
  fdb_config fStack_c60;
  fdb_doc *pfStack_b68;
  fdb_kvs_handle *pfStack_b58;
  fdb_file_handle *pfStack_b50;
  int iStack_b44;
  fdb_iterator *pfStack_b40;
  fdb_doc *pfStack_b38;
  undefined1 auStack_b30 [48];
  timeval tStack_b00;
  fdb_doc *apfStack_af0 [9];
  long lStack_aa8;
  fdb_doc *apfStack_aa0 [5];
  fdb_doc *apfStack_a78 [5];
  fdb_doc afStack_a50 [3];
  fdb_doc *apfStack_920 [32];
  fdb_doc afStack_820 [3];
  fdb_config fStack_720;
  fdb_kvs_info *pfStack_628;
  long lStack_620;
  fdb_kvs_handle *pfStack_618;
  uint64_t *puStack_610;
  uint64_t *puStack_608;
  code *pcStack_600;
  fdb_kvs_handle *local_5e8;
  fdb_kvs_info local_5e0;
  fdb_kvs_info local_5b0;
  timeval local_580;
  fdb_kvs_config local_570;
  fdb_doc *apfStack_558 [101];
  fdb_config local_230;
  char local_138 [264];
  
  pcStack_600 = (code *)0x115feb;
  gettimeofday(&local_580,(__timezone_ptr_t)0x0);
  pcStack_600 = (code *)0x115ff0;
  memleak_start();
  pcStack_600 = (code *)0x116000;
  fdb_get_default_config();
  pcStack_600 = (code *)0x116010;
  fdb_get_default_kvs_config();
  local_5e0.name = (char *)0x0;
  pcStack_600 = (code *)0x116021;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 100;
  local_230.seqtree_opt = '\x01';
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.purging_interval = 5;
  local_230.block_reusing_threshold = 0;
  pcStack_600 = (code *)0x116061;
  fdb_open((fdb_file_handle **)&local_5e0.last_seqnum,"./mvcc_test1",&local_230);
  pcStack_600 = (code *)0x116078;
  fdb_kvs_open((fdb_file_handle *)local_5e0.last_seqnum,&local_5e8,"kv1",&local_570);
  pcStack_600 = (code *)0x11608a;
  fdb_kvs_open((fdb_file_handle *)local_5e0.last_seqnum,(fdb_kvs_handle **)&local_5e0.deleted_count,
               (char *)0x0,&local_570);
  lVar10 = 0;
  uVar14 = 0;
  do {
    pcStack_600 = (code *)0x1160b3;
    sprintf(local_138,"key%d",uVar14 & 0xffffffff);
    pcStack_600 = (code *)0x1160c6;
    sVar3 = strlen(local_138);
    pcStack_600 = (code *)0x1160e4;
    fdb_doc_create((fdb_doc **)((long)apfStack_558 + lVar10),local_138,sVar3,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_600 = (code *)0x1160f6;
    fdb_set(local_5e8,apfStack_558[uVar14]);
    handle = local_5e0.deleted_count;
    pcStack_600 = (code *)0x116103;
    sVar3 = strlen(local_138);
    pcStack_600 = (code *)0x11611a;
    fdb_set_kv((fdb_kvs_handle *)handle,local_138,sVar3,(void *)((long)&local_5e0.file + 5),3);
    uVar14 = uVar14 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar14 != 0x65);
  pcStack_600 = (code *)0x11613d;
  fdb_del(local_5e8,apfStack_558[100]);
  pcStack_600 = (code *)0x11614c;
  fdb_commit((fdb_file_handle *)local_5e0.last_seqnum,'\x01');
  pcStack_600 = (code *)0x11615e;
  fdb_get_kvs_info(local_5e8,&local_5b0);
  puVar18 = (uint64_t *)local_5b0.last_seqnum;
  lVar19 = 0;
  do {
    pcStack_600 = (code *)0x116177;
    fdb_del(local_5e8,apfStack_558[lVar19]);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 100);
  lVar19 = 0;
  pcStack_600 = (code *)0x11618f;
  fdb_commit((fdb_file_handle *)local_5e0.last_seqnum,'\0');
  info_00 = &local_5b0;
  pcStack_600 = (code *)0x1161a1;
  fdb_get_kvs_info(local_5e8,info_00);
  do {
    pfVar6 = apfStack_558[lVar19];
    pfVar6->deleted = false;
    pcStack_600 = (code *)0x1161bb;
    fdb_set(local_5e8,pfVar6);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 100);
  pcStack_600 = (code *)0x1161d0;
  fdb_commit((fdb_file_handle *)local_5e0.last_seqnum,'\0');
  ppfVar12 = &local_5e8;
  pcStack_600 = (code *)0x1161dd;
  fVar1 = fdb_rollback(ppfVar12,(long)(int)puVar18);
  iVar2 = (int)ppfVar12;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    info_00 = &local_5b0;
    pcStack_600 = (code *)0x1161f7;
    fdb_get_kvs_info(local_5e8,info_00);
    if (local_5b0.deleted_count != 1) {
      pcStack_600 = (code *)0x116208;
      rollback_forward_seqnum();
    }
    ppfVar12 = &local_5e8;
    pcStack_600 = (code *)0x116215;
    fVar1 = fdb_rollback(ppfVar12,(long)(int)local_5b0.last_seqnum);
    iVar2 = (int)ppfVar12;
    if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00116371;
    pcStack_600 = (code *)0x116234;
    fVar1 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)local_5e0.deleted_count,
                       (fdb_iterator **)&local_5e0.doc_count,0,0,0);
    iVar2 = (int)local_5e0.deleted_count;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      info_00 = &local_5e0;
      puVar18 = &local_5e0.space_used;
      while( true ) {
        pcStack_600 = (code *)0x116253;
        pfVar13 = (fdb_iterator *)local_5e0.doc_count;
        fVar1 = fdb_iterator_get((fdb_iterator *)local_5e0.doc_count,(fdb_doc **)info_00);
        iVar2 = (int)pfVar13;
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        if (*(fdb_seqnum_t *)((long)local_5e0.name + 0x28) == 0x65) {
          pcStack_600 = (code *)0x116271;
          pfVar17 = local_5e8;
          fVar1 = fdb_get_metaonly(local_5e8,(fdb_doc *)local_5e0.name);
          iVar2 = (int)pfVar17;
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116367;
          pfVar6 = (fdb_doc *)local_5e0.name;
          if (*(bool *)((long)local_5e0.name + 0x48) == false) {
            pcStack_600 = (code *)0x11628f;
            rollback_forward_seqnum();
            pfVar6 = (fdb_doc *)local_5e0.space_used;
          }
        }
        else {
          pcStack_600 = (code *)0x116296;
          pfVar17 = local_5e8;
          fVar1 = fdb_get_metaonly_byseq(local_5e8,(fdb_doc *)local_5e0.name);
          iVar2 = (int)pfVar17;
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116362;
          pfVar6 = (fdb_doc *)local_5e0.name;
          if (*(bool *)((long)local_5e0.name + 0x48) != false) {
            pcStack_600 = (code *)0x1162d3;
            rollback_forward_seqnum();
            pfVar6 = (fdb_doc *)local_5e0.space_used;
          }
        }
        pcStack_600 = (code *)0x1162ae;
        fdb_doc_free(pfVar6);
        local_5e0.name = (char *)0x0;
        pcStack_600 = (code *)0x1162c1;
        fVar1 = fdb_iterator_next((fdb_iterator *)local_5e0.doc_count);
        if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
          lVar10 = 0;
          do {
            pcStack_600 = (code *)0x1162e9;
            fdb_doc_free(apfStack_558[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x65);
          pcStack_600 = (code *)0x1162fc;
          fdb_iterator_close((fdb_iterator *)local_5e0.doc_count);
          pcStack_600 = (code *)0x116306;
          fdb_kvs_close(local_5e8);
          pcStack_600 = (code *)0x116310;
          fdb_close((fdb_file_handle *)local_5e0.last_seqnum);
          pcStack_600 = (code *)0x116315;
          fdb_shutdown();
          pcStack_600 = (code *)0x11631a;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (rollback_forward_seqnum()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pcStack_600 = (code *)0x11634b;
          fprintf(_stderr,pcVar11,"rollback forward seqnum");
          return;
        }
      }
      pcStack_600 = (code *)0x116362;
      rollback_forward_seqnum();
LAB_00116362:
      pcStack_600 = (code *)0x116367;
      rollback_forward_seqnum();
LAB_00116367:
      pcStack_600 = (code *)0x11636c;
      rollback_forward_seqnum();
      goto LAB_0011636c;
    }
  }
  else {
LAB_0011636c:
    pcStack_600 = (code *)0x116371;
    rollback_forward_seqnum();
LAB_00116371:
    pcStack_600 = (code *)0x116376;
    rollback_forward_seqnum();
  }
  pcStack_600 = rollback_test;
  rollback_forward_seqnum();
  puStack_608 = (uint64_t *)local_5b0.last_seqnum;
  pfStack_618 = (fdb_kvs_handle *)handle;
  pfStack_b68 = (fdb_doc *)0x11639d;
  pfStack_628 = info_00;
  lStack_620 = lVar19;
  puStack_610 = puVar18;
  pcStack_600 = (code *)lVar10;
  gettimeofday(&tStack_b00,(__timezone_ptr_t)0x0);
  pfStack_b68 = (fdb_doc *)0x1163a2;
  memleak_start();
  pfStack_b38 = (fdb_doc *)0x0;
  pfStack_b68 = (fdb_doc *)0x1163b6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b68 = (fdb_doc *)0x1163c6;
  fdb_get_default_config();
  pfStack_b68 = (fdb_doc *)0x1163d0;
  fdb_get_default_kvs_config();
  fStack_720.buffercache_size = 0;
  fStack_720.seqtree_opt = '\x01';
  fStack_720.wal_threshold = 0x400;
  fStack_720.flags = 1;
  fStack_720.compaction_threshold = '\0';
  pfStack_b68 = (fdb_doc *)0x1163fa;
  fStack_720.multi_kv_instances = (bool)(char)iVar2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b68 = (fdb_doc *)0x116411;
  fdb_open(&pfStack_b50,"./mvcc_test1",&fStack_720);
  iStack_b44 = iVar2;
  if (iVar2 == 0) {
    pfStack_b68 = (fdb_doc *)0x116439;
    fdb_kvs_open(pfStack_b50,&pfStack_b58,(char *)0x0,(fdb_kvs_config *)(auStack_b30 + 0x18));
  }
  else {
    pfStack_b68 = (fdb_doc *)0x11642b;
    fdb_kvs_open_default(pfStack_b50,&pfStack_b58,(fdb_kvs_config *)(auStack_b30 + 0x18));
  }
  lVar10 = 0;
  uVar14 = 0;
  do {
    pfStack_b68 = (fdb_doc *)0x11645b;
    sprintf((char *)&afStack_a50[0].offset,"key%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x116477;
    sprintf((char *)afStack_820,"meta%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x116493;
    sprintf((char *)apfStack_920,"body%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x1164a3;
    sVar3 = strlen((char *)&afStack_a50[0].offset);
    pfStack_b68 = (fdb_doc *)0x1164ae;
    sVar4 = strlen((char *)afStack_820);
    pfStack_b68 = (fdb_doc *)0x1164b9;
    sVar5 = strlen((char *)apfStack_920);
    pfStack_b68 = (fdb_doc *)0x1164de;
    fdb_doc_create((fdb_doc **)((long)apfStack_af0 + lVar10),&afStack_a50[0].offset,sVar3,
                   afStack_820,sVar4,apfStack_920,sVar5);
    pfStack_b68 = (fdb_doc *)0x1164ed;
    fdb_set(pfStack_b58,apfStack_af0[uVar14]);
    uVar14 = uVar14 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar14 != 5);
  pfStack_b68 = (fdb_doc *)0x11650d;
  fdb_commit(pfStack_b50,'\x01');
  uVar14 = 5;
  ppfVar15 = apfStack_af0 + 5;
  do {
    pfStack_b68 = (fdb_doc *)0x116537;
    sprintf((char *)&afStack_a50[0].offset,"key%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x116553;
    sprintf((char *)afStack_820,"meta%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x11656f;
    sprintf((char *)apfStack_920,"body%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x116577;
    sVar3 = strlen((char *)&afStack_a50[0].offset);
    pfStack_b68 = (fdb_doc *)0x116582;
    sVar4 = strlen((char *)afStack_820);
    pfStack_b68 = (fdb_doc *)0x11658d;
    sVar5 = strlen((char *)apfStack_920);
    pfStack_b68 = (fdb_doc *)0x1165ad;
    fdb_doc_create(ppfVar15,&afStack_a50[0].offset,sVar3,afStack_820,sVar4,apfStack_920,sVar5);
    pfStack_b68 = (fdb_doc *)0x1165ba;
    fdb_set(pfStack_b58,*ppfVar15);
    uVar14 = uVar14 + 1;
    ppfVar15 = ppfVar15 + 1;
  } while (uVar14 != 10);
  pfStack_b68 = (fdb_doc *)0x1165d7;
  fdb_commit(pfStack_b50,'\0');
  ppfVar15 = apfStack_aa0;
  auStack_b30._16_8_ = *(undefined8 *)(lStack_aa8 + 0x28);
  uVar14 = 10;
  do {
    pfStack_b68 = (fdb_doc *)0x11660e;
    sprintf((char *)&afStack_a50[0].offset,"key%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x11662a;
    sprintf((char *)afStack_820,"meta%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x116646;
    sprintf((char *)apfStack_920,"body%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x11664e;
    sVar3 = strlen((char *)&afStack_a50[0].offset);
    pfStack_b68 = (fdb_doc *)0x116659;
    sVar4 = strlen((char *)afStack_820);
    pfStack_b68 = (fdb_doc *)0x116664;
    sVar5 = strlen((char *)apfStack_920);
    pfStack_b68 = (fdb_doc *)0x116684;
    fdb_doc_create(ppfVar15,&afStack_a50[0].offset,sVar3,afStack_820,sVar4,apfStack_920,sVar5);
    pfStack_b68 = (fdb_doc *)0x116691;
    fdb_set(pfStack_b58,*ppfVar15);
    uVar14 = uVar14 + 1;
    ppfVar15 = ppfVar15 + 1;
  } while (uVar14 != 0xf);
  pfStack_b68 = (fdb_doc *)0x1166b1;
  fdb_commit(pfStack_b50,'\x01');
  uVar14 = 0xf;
  ppfVar15 = apfStack_a78;
  do {
    pfStack_b68 = (fdb_doc *)0x1166db;
    sprintf((char *)&afStack_a50[0].offset,"key%d",uVar14 & 0xffffffff);
    pfVar6 = afStack_820;
    pfStack_b68 = (fdb_doc *)0x1166f7;
    sprintf((char *)pfVar6,"meta%d",uVar14 & 0xffffffff);
    doc_01 = apfStack_920;
    pfStack_b68 = (fdb_doc *)0x116713;
    sprintf((char *)doc_01,"body%d",uVar14 & 0xffffffff);
    pfStack_b68 = (fdb_doc *)0x11671b;
    sVar3 = strlen((char *)&afStack_a50[0].offset);
    pfStack_b68 = (fdb_doc *)0x116726;
    metalen = (fdb_doc *)strlen((char *)pfVar6);
    pfStack_b68 = (fdb_doc *)0x116731;
    sVar4 = strlen((char *)doc_01);
    pfStack_b68 = (fdb_doc *)0x116751;
    fdb_doc_create(ppfVar15,&afStack_a50[0].offset,sVar3,pfVar6,(size_t)metalen,doc_01,sVar4);
    pfStack_b68 = (fdb_doc *)0x11675f;
    fdb_set(pfStack_b58,*ppfVar15);
    uVar14 = uVar14 + 1;
    ppfVar15 = ppfVar15 + 1;
  } while (uVar14 != 0x14);
  pfStack_b68 = (fdb_doc *)0x11677c;
  fdb_commit(pfStack_b50,'\0');
  pfStack_b68 = (fdb_doc *)0x116794;
  fVar1 = fdb_set_log_callback(pfStack_b58,logCallbackFunc,"rollback_test");
  pvVar20 = (void *)0x14;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_b68 = (fdb_doc *)0x1167ab;
    fVar1 = fdb_rollback(&pfStack_b58,999999);
    doc_00 = pfVar6;
    if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00116a4d;
    doc_00 = (fdb_doc *)auStack_b30;
    pfStack_b68 = (fdb_doc *)0x1167d0;
    fdb_open((fdb_file_handle **)doc_00,"./mvcc_test1",&fStack_720);
    doc_01 = (fdb_doc **)auStack_b30._16_8_;
    if ((char)iStack_b44 == '\0') {
      pfStack_b68 = (fdb_doc *)0x1167fc;
      fdb_kvs_open((fdb_file_handle *)auStack_b30._0_8_,(fdb_kvs_handle **)(auStack_b30 + 8),
                   (char *)0x0,(fdb_kvs_config *)(auStack_b30 + 0x18));
    }
    else {
      pfStack_b68 = (fdb_doc *)0x1167ee;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_b30._0_8_,(fdb_kvs_handle **)(auStack_b30 + 8),
                 (fdb_kvs_config *)(auStack_b30 + 0x18));
    }
    pfStack_b68 = (fdb_doc *)0x11680b;
    fdb_begin_transaction((fdb_file_handle *)auStack_b30._0_8_,'\x02');
    pfStack_b68 = (fdb_doc *)0x116818;
    fVar1 = fdb_rollback(&pfStack_b58,(fdb_seqnum_t)doc_01);
    if (fVar1 != FDB_RESULT_FAIL_BY_TRANSACTION) goto LAB_00116a52;
    pfStack_b68 = (fdb_doc *)0x11682b;
    fdb_abort_transaction((fdb_file_handle *)auStack_b30._0_8_);
    pfStack_b68 = (fdb_doc *)0x116835;
    fdb_kvs_close((fdb_kvs_handle *)auStack_b30._8_8_);
    pfStack_b68 = (fdb_doc *)0x11683f;
    fdb_close((fdb_file_handle *)auStack_b30._0_8_);
    pfStack_b68 = (fdb_doc *)0x11684c;
    fVar1 = fdb_rollback(&pfStack_b58,(fdb_seqnum_t)doc_01);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116a57;
    pfStack_b68 = (fdb_doc *)0x116869;
    fdb_get_kvs_info(pfStack_b58,(fdb_kvs_info *)afStack_a50);
    if ((fdb_doc **)afStack_a50[0].metalen != doc_01) {
      pfStack_b68 = (fdb_doc *)0x11687f;
      rollback_test();
    }
    *(undefined1 *)apfStack_aa0[0]->body = 0x42;
    pfStack_b68 = (fdb_doc *)0x1168a0;
    fdb_set(pfStack_b58,apfStack_aa0[0]);
    sVar3 = 0;
    pfStack_b68 = (fdb_doc *)0x1168af;
    fdb_commit(pfStack_b50,'\0');
    pfStack_b68 = (fdb_doc *)0x1168c5;
    fdb_iterator_sequence_init(pfStack_b58,&pfStack_b40,0,0,0);
    doc_01 = &pfStack_b38;
    pfVar6 = afStack_a50;
    do {
      pfStack_b68 = (fdb_doc *)0x1168d7;
      fVar1 = fdb_iterator_get(pfStack_b40,doc_01);
      doc_00 = pfStack_b38;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00116a2d:
        pfStack_b68 = (fdb_doc *)0x116a32;
        rollback_test();
LAB_00116a32:
        pfStack_b68 = (fdb_doc *)0x116a3d;
        rollback_test();
LAB_00116a3d:
        pfStack_b68 = (fdb_doc *)0x116a48;
        rollback_test();
        goto LAB_00116a48;
      }
      pvVar20 = pfStack_b38->key;
      metalen = apfStack_af0[sVar3];
      ppfVar15 = (fdb_doc **)metalen->key;
      pfStack_b68 = (fdb_doc *)0x1168ff;
      iVar2 = bcmp(pvVar20,ppfVar15,pfStack_b38->keylen);
      pfVar6 = doc_00;
      if (iVar2 != 0) {
        pfStack_b68 = (fdb_doc *)0x116a2d;
        rollback_test();
        goto LAB_00116a2d;
      }
      pvVar20 = doc_00->meta;
      ppfVar15 = (fdb_doc **)metalen->meta;
      pfStack_b68 = (fdb_doc *)0x11691e;
      iVar2 = bcmp(pvVar20,ppfVar15,doc_00->metalen);
      if (iVar2 != 0) goto LAB_00116a3d;
      pvVar20 = doc_00->body;
      ppfVar15 = (fdb_doc **)metalen->body;
      pfStack_b68 = (fdb_doc *)0x11693d;
      iVar2 = bcmp(pvVar20,ppfVar15,doc_00->bodylen);
      if (iVar2 != 0) goto LAB_00116a32;
      pfStack_b68 = (fdb_doc *)0x11694d;
      fdb_doc_free(doc_00);
      pfStack_b38 = (fdb_doc *)0x0;
      sVar3 = sVar3 + 1;
      pfStack_b68 = (fdb_doc *)0x116963;
      fVar1 = fdb_iterator_next(pfStack_b40);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)sVar3 == 0xb) {
      pfStack_b68 = (fdb_doc *)0x116980;
      fdb_iterator_close(pfStack_b40);
      pfStack_b68 = (fdb_doc *)0x11698a;
      fdb_kvs_close(pfStack_b58);
      pfStack_b68 = (fdb_doc *)0x116994;
      fdb_close(pfStack_b50);
      lVar10 = 0;
      do {
        pfStack_b68 = (fdb_doc *)0x1169a0;
        fdb_doc_free(apfStack_af0[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x14);
      pfStack_b68 = (fdb_doc *)0x1169ae;
      fdb_shutdown();
      pfStack_b68 = (fdb_doc *)0x1169b3;
      memleak_end();
      pcVar11 = "single kv mode:";
      if ((char)iStack_b44 != '\0') {
        pcVar11 = "multiple kv mode:";
      }
      pfStack_b68 = (fdb_doc *)0x1169e3;
      sprintf((char *)apfStack_920,"rollback test %s",pcVar11);
      pcVar11 = "%s PASSED\n";
      if (rollback_test(bool)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_b68 = (fdb_doc *)0x116a10;
      fprintf(_stderr,pcVar11,apfStack_920);
      return;
    }
  }
  else {
LAB_00116a48:
    pfStack_b68 = (fdb_doc *)0x116a4d;
    rollback_test();
    doc_00 = pfVar6;
LAB_00116a4d:
    pfStack_b68 = (fdb_doc *)0x116a52;
    rollback_test();
LAB_00116a52:
    pfStack_b68 = (fdb_doc *)0x116a57;
    rollback_test();
LAB_00116a57:
    pfStack_b68 = (fdb_doc *)0x116a5c;
    rollback_test();
  }
  pfStack_b68 = (fdb_doc *)rollback_and_snapshot_test;
  rollback_test();
  pfStack_cf0 = (fdb_doc *)0x116a75;
  pfStack_b68 = doc_00;
  gettimeofday(&tStack_c70,(__timezone_ptr_t)0x0);
  pfStack_cf0 = (fdb_doc *)0x116a7a;
  memleak_start();
  pfStack_cf0 = (fdb_doc *)0x116a86;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_c60;
  pfStack_cf0 = (fdb_doc *)0x116a96;
  fdb_get_default_config();
  pfStack_cf0 = (fdb_doc *)0x116aa0;
  fdb_get_default_kvs_config();
  pfStack_cf0 = (fdb_doc *)0x116ab4;
  fVar1 = fdb_open(&pfStack_cd8,"mvcc_test",fconfig_01);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_cf0 = (fdb_doc *)0x116ad2;
    fVar1 = fdb_kvs_open(pfStack_cd8,&pfStack_ce0,(char *)0x0,&fStack_c88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cdb;
    pfStack_cf0 = (fdb_doc *)0x116afd;
    fVar1 = fdb_set_kv(pfStack_ce0,"a",1,"val-a",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ce0;
    pfStack_cf0 = (fdb_doc *)0x116b11;
    fVar1 = fdb_commit(pfStack_cd8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ce5;
    pfStack_cf0 = (fdb_doc *)0x116b28;
    fVar1 = fdb_get_kvs_info(pfStack_ce0,&fStack_cb8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cea;
    pfStack_cf0 = (fdb_doc *)0x116b53;
    fVar1 = fdb_set_kv(pfStack_ce0,"b",1,"val-b",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cef;
    pfStack_cf0 = (fdb_doc *)0x116b67;
    fVar1 = fdb_commit(pfStack_cd8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cf4;
    pfStack_cf0 = (fdb_doc *)0x116b7e;
    fVar1 = fdb_get_kvs_info(pfStack_ce0,&fStack_cb8);
    fVar7 = fStack_cb8.last_seqnum;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cf9;
    pfStack_cf0 = (fdb_doc *)0x116bae;
    fVar1 = fdb_set_kv(pfStack_ce0,"c",1,"val-c",5);
    fconfig_01 = (fdb_config *)fVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116cfe;
    pfStack_cf0 = (fdb_doc *)0x116bc2;
    fVar1 = fdb_commit(pfStack_cd8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116d03;
    pfStack_cf0 = (fdb_doc *)0x116bd9;
    fVar1 = fdb_get_kvs_info(pfStack_ce0,&fStack_cb8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116d08;
    pfStack_cf0 = (fdb_doc *)0x116bee;
    fVar1 = fdb_rollback(&pfStack_ce0,fVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116d0d;
    pfStack_cf0 = (fdb_doc *)0x116c05;
    fVar1 = fdb_get_kvs_info(pfStack_ce0,&fStack_cb8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116d12;
    pfStack_cf0 = (fdb_doc *)0x116c32;
    fVar1 = fdb_get_kv(pfStack_ce0,"c",1,&pvStack_cc0,&sStack_cc8);
    fconfig_01 = (fdb_config *)fStack_cb8.last_seqnum;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116d17;
    pfStack_cf0 = (fdb_doc *)0x116c4d;
    fVar1 = fdb_snapshot_open(pfStack_ce0,&pfStack_cd0,fStack_cb8.last_seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116d1c;
    pfStack_cf0 = (fdb_doc *)0x116c75;
    fVar1 = fdb_get_kv(pfStack_cd0,"c",1,&pvStack_cc0,&sStack_cc8);
    if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
      pfStack_cf0 = (fdb_doc *)0x116c88;
      fdb_kvs_close(pfStack_cd0);
      pfStack_cf0 = (fdb_doc *)0x116c92;
      fdb_close(pfStack_cd8);
      pfStack_cf0 = (fdb_doc *)0x116c97;
      fdb_shutdown();
      pfStack_cf0 = (fdb_doc *)0x116c9c;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_and_snapshot_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_cf0 = (fdb_doc *)0x116ccd;
      fprintf(_stderr,pcVar11,"rollback and snapshot test");
      return;
    }
  }
  else {
    pfStack_cf0 = (fdb_doc *)0x116cdb;
    rollback_and_snapshot_test();
LAB_00116cdb:
    pfStack_cf0 = (fdb_doc *)0x116ce0;
    rollback_and_snapshot_test();
LAB_00116ce0:
    pfStack_cf0 = (fdb_doc *)0x116ce5;
    rollback_and_snapshot_test();
LAB_00116ce5:
    pfStack_cf0 = (fdb_doc *)0x116cea;
    rollback_and_snapshot_test();
LAB_00116cea:
    pfStack_cf0 = (fdb_doc *)0x116cef;
    rollback_and_snapshot_test();
LAB_00116cef:
    pfStack_cf0 = (fdb_doc *)0x116cf4;
    rollback_and_snapshot_test();
LAB_00116cf4:
    pfStack_cf0 = (fdb_doc *)0x116cf9;
    rollback_and_snapshot_test();
LAB_00116cf9:
    pfStack_cf0 = (fdb_doc *)0x116cfe;
    rollback_and_snapshot_test();
LAB_00116cfe:
    pfStack_cf0 = (fdb_doc *)0x116d03;
    rollback_and_snapshot_test();
LAB_00116d03:
    pfStack_cf0 = (fdb_doc *)0x116d08;
    rollback_and_snapshot_test();
LAB_00116d08:
    pfStack_cf0 = (fdb_doc *)0x116d0d;
    rollback_and_snapshot_test();
LAB_00116d0d:
    pfStack_cf0 = (fdb_doc *)0x116d12;
    rollback_and_snapshot_test();
LAB_00116d12:
    pfStack_cf0 = (fdb_doc *)0x116d17;
    rollback_and_snapshot_test();
LAB_00116d17:
    pfStack_cf0 = (fdb_doc *)0x116d1c;
    rollback_and_snapshot_test();
LAB_00116d1c:
    pfStack_cf0 = (fdb_doc *)0x116d21;
    rollback_and_snapshot_test();
  }
  pfStack_cf0 = (fdb_doc *)rollback_ncommits;
  rollback_and_snapshot_test();
  pfStack_f98 = (fdb_kvs_handle *)0x116d43;
  pfStack_d18 = fconfig_01;
  ppfStack_d10 = ppfVar15;
  sStack_d08 = sVar3;
  ppfStack_d00 = doc_01;
  pvStack_cf8 = pvVar20;
  pfStack_cf0 = metalen;
  gettimeofday((timeval *)(auStack_f70 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_f98 = (fdb_kvs_handle *)0x116d48;
  memleak_start();
  pfStack_f98 = (fdb_kvs_handle *)0x116d55;
  fdb_get_default_config();
  pfStack_f98 = (fdb_kvs_handle *)0x116d62;
  fdb_get_default_kvs_config();
  pfStack_f98 = (fdb_kvs_handle *)0x116d6e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fStack_f18.wal_threshold = 0x400;
  fStack_f18.flags = 1;
  fStack_f18.compaction_threshold = '\0';
  fStack_f18.block_reusing_threshold = 0;
  pfStack_f98 = (fdb_kvs_handle *)0x116da5;
  fdb_open(&pfStack_f80,"./mvcc_test1",&fStack_f18);
  pfStack_f98 = (fdb_kvs_handle *)0x116dbc;
  fdb_kvs_open(pfStack_f80,&pfStack_f88,"kv1",&fStack_f30);
  pfStack_f98 = (fdb_kvs_handle *)0x116dce;
  fdb_kvs_open(pfStack_f80,&pfStack_f78,(char *)0x0,&fStack_f30);
  pfVar17 = (fdb_kvs_handle *)auStack_f70;
  doc = (fdb_kvs_handle *)0x0;
  do {
    iVar2 = 0;
    do {
      pfStack_f98 = (fdb_kvs_handle *)0x116df7;
      sprintf(acStack_e20,"key%02d%03d",doc);
      pfVar16 = pfStack_f88;
      pfStack_f98 = (fdb_kvs_handle *)0x116e04;
      sVar3 = strlen(acStack_e20);
      pfStack_f98 = (fdb_kvs_handle *)0x116e17;
      fdb_set_kv(pfVar16,acStack_e20,sVar3,(void *)0x0,0);
      pfVar16 = pfStack_f78;
      pfStack_f98 = (fdb_kvs_handle *)0x116e24;
      sVar3 = strlen(acStack_e20);
      pfStack_f98 = (fdb_kvs_handle *)0x116e37;
      fdb_set_kv(pfVar16,acStack_e20,sVar3,(void *)0x0,0);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 100);
    pfStack_f98 = (fdb_kvs_handle *)0x116e4d;
    fdb_commit(pfStack_f80,(byte)doc & 1);
    pfStack_f98 = (fdb_kvs_handle *)0x116e5a;
    fdb_get_kvs_info(pfStack_f88,(fdb_kvs_info *)pfVar17);
    if (auStack_f70._16_8_ != auStack_f70._8_8_) {
      pfStack_f98 = (fdb_kvs_handle *)0x116e82;
      rollback_ncommits();
    }
    uVar9 = (int)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  uVar14 = 0xb;
  fVar7 = 1000;
  pfVar16 = (fdb_kvs_handle *)auStack_f70;
  while( true ) {
    pfStack_f98 = (fdb_kvs_handle *)0x116ea4;
    fVar1 = fdb_rollback(&pfStack_f88,fVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStack_f98 = (fdb_kvs_handle *)0x116eb9;
    fdb_get_kvs_info(pfStack_f88,(fdb_kvs_info *)pfVar16);
    if (auStack_f70._16_8_ != auStack_f70._8_8_) {
      pfStack_f98 = (fdb_kvs_handle *)0x116ee3;
      rollback_ncommits();
    }
    uVar14 = uVar14 - 1;
    fVar7 = fVar7 - 100;
    if (uVar14 < 2) {
      pfStack_f98 = (fdb_kvs_handle *)0x116eef;
      fdb_kvs_close(pfStack_f88);
      pfStack_f98 = (fdb_kvs_handle *)0x116ef9;
      fdb_close(pfStack_f80);
      pfStack_f98 = (fdb_kvs_handle *)0x116efe;
      fdb_shutdown();
      pfStack_f98 = (fdb_kvs_handle *)0x116f03;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_f98 = (fdb_kvs_handle *)0x116f34;
      fprintf(_stderr,pcVar11,"rollback n commits");
      return;
    }
  }
  pfStack_f98 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_1490 = (fdb_kvs_handle *)0x116f6b;
  fStack_11b8.bub_ctx.space_used = fVar7;
  fStack_11b8.bub_ctx.handle = pfVar16;
  pfStack_fb0 = pfVar17;
  uStack_fa8 = uVar14;
  ppfStack_fa0 = &pfStack_f88;
  pfStack_f98 = doc;
  gettimeofday(&tStack_11c8,(__timezone_ptr_t)0x0);
  pfStack_1490 = (fdb_kvs_handle *)0x116f70;
  memleak_start();
  pfStack_1490 = (fdb_kvs_handle *)0x116f7c;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1490 = (fdb_kvs_handle *)0x116f8c;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_1430;
  pfStack_1490 = (fdb_kvs_handle *)0x116f99;
  fdb_get_default_kvs_config();
  fStack_11b8.config.encryption_key.bytes[4] = '\0';
  fStack_11b8.config.encryption_key.bytes[5] = '\0';
  fStack_11b8.config.encryption_key.bytes[6] = '\0';
  fStack_11b8.config.encryption_key.bytes[7] = '\0';
  fStack_11b8.config.encryption_key.bytes[8] = '\0';
  fStack_11b8.config.encryption_key.bytes[9] = '\0';
  fStack_11b8.config.encryption_key.bytes[10] = '\0';
  fStack_11b8.config.encryption_key.bytes[0xb] = '\0';
  fStack_11b8.config.encryption_key.bytes[0xc] = '\0';
  fStack_11b8.config.encryption_key.bytes[0xd] = '\x04';
  fStack_11b8.config.encryption_key.bytes[0xe] = '\0';
  fStack_11b8.config.encryption_key.bytes[0xf] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x10] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x11] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x12] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x13] = '\0';
  fStack_11b8.config._180_4_ = 1;
  fStack_11b8.config.encryption_key.bytes[0x18] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x19] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x1a] = '\0';
  fStack_11b8.config.encryption_key.bytes[0x1b] = '\0';
  fStack_11b8.config.block_reusing_threshold._7_1_ = 0;
  pfVar8 = (fdb_kvs_handle *)auStack_1458;
  pfStack_1490 = (fdb_kvs_handle *)0x116fd2;
  fdb_open((fdb_file_handle **)pfVar8,"mvcc_test1",(fdb_config *)&fStack_11b8.config.encryption_key)
  ;
  pcVar11 = auStack_1478 + 8;
  pfStack_1490 = (fdb_kvs_handle *)0x116fe5;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1458._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)config);
  pfStack_1490 = (fdb_kvs_handle *)0x116ffb;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1478._8_8_,logCallbackFunc,"transaction_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f8f;
  fconfig_00 = &fStack_11b8.config.encryption_key;
  pfStack_1490 = (fdb_kvs_handle *)0x117025;
  fdb_open(&pfStack_1460,"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_1490 = (fdb_kvs_handle *)0x117038;
  fdb_open((fdb_file_handle **)(auStack_1458 + 0x10),"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_1490 = (fdb_kvs_handle *)0x11704d;
  fdb_kvs_open_default(pfStack_1460,&pfStack_1468,(fdb_kvs_config *)auStack_1430);
  pfStack_1490 = (fdb_kvs_handle *)0x11705e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1458._16_8_,(fdb_kvs_handle **)(auStack_1458 + 8),
             (fdb_kvs_config *)auStack_1430);
  pfStack_1490 = (fdb_kvs_handle *)0x11706b;
  fdb_begin_transaction(pfStack_1460,'\x02');
  pfStack_1490 = (fdb_kvs_handle *)0x117079;
  fdb_begin_transaction((fdb_file_handle *)auStack_1458._16_8_,'\x02');
  lVar10 = 0;
  uVar14 = 0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117099;
    sprintf(auStack_1318 + 0x50,"key%d",uVar14 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x1170b1;
    sprintf((char *)&fStack_11b8,"meta%d",uVar14 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x1170c6;
    sprintf(auStack_1430 + 0x18,"body%d",uVar14 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x1170d9;
    sVar3 = strlen(auStack_1318 + 0x50);
    pfStack_1490 = (fdb_kvs_handle *)0x1170ec;
    sVar4 = strlen((char *)&fStack_11b8);
    pfStack_1490 = (fdb_kvs_handle *)0x1170f9;
    sVar5 = strlen(auStack_1430 + 0x18);
    pfStack_1490 = (fdb_kvs_handle *)0x11711b;
    fdb_doc_create((fdb_doc **)(auStack_1318 + lVar10),auStack_1318 + 0x50,sVar3,&fStack_11b8,sVar4,
                   auStack_1430 + 0x18,sVar5);
    pfStack_1490 = (fdb_kvs_handle *)0x11712d;
    fdb_set(pfStack_1468,*(fdb_doc **)(auStack_1318 + uVar14 * 8));
    uVar14 = uVar14 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar14 != 5);
  uVar14 = 5;
  pfVar17 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117164;
    sprintf(auStack_1318 + 0x50,"key%d",uVar14 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x11717c;
    sprintf((char *)&fStack_11b8,"meta%d",uVar14 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x117191;
    sprintf(auStack_1430 + 0x18,"body%d",uVar14 & 0xffffffff);
    pfVar16 = (fdb_kvs_handle *)(auStack_1318 + (long)pfVar17);
    pfStack_1490 = (fdb_kvs_handle *)0x1171a4;
    sVar3 = strlen(auStack_1318 + 0x50);
    pfStack_1490 = (fdb_kvs_handle *)0x1171b7;
    sVar4 = strlen((char *)&fStack_11b8);
    pfStack_1490 = (fdb_kvs_handle *)0x1171c4;
    sVar5 = strlen(auStack_1430 + 0x18);
    pfStack_1490 = (fdb_kvs_handle *)0x1171e6;
    fdb_doc_create((fdb_doc **)pfVar16,auStack_1318 + 0x50,sVar3,&fStack_11b8,sVar4,
                   auStack_1430 + 0x18,sVar5);
    pfStack_1490 = (fdb_kvs_handle *)0x1171f8;
    fdb_set((fdb_kvs_handle *)auStack_1458._8_8_,*(fdb_doc **)(auStack_1318 + uVar14 * 8));
    uVar14 = uVar14 + 1;
    pfVar17 = (fdb_kvs_handle *)((long)pfVar17 + 8);
  } while (uVar14 != 10);
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x11722e;
    sprintf((char *)config,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x117236;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117254;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117263;
    fVar1 = fdb_get(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
    if ((uint)doc < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f71;
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00117f76;
    pfStack_1490 = (fdb_kvs_handle *)0x117283;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (uint)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x1172a6;
  fdb_open((fdb_file_handle **)(auStack_1458 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_11b8.config.encryption_key);
  pfStack_1490 = (fdb_kvs_handle *)0x1172b8;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1458._24_8_,(fdb_kvs_handle **)(auStack_1458 + 0x20),
             (fdb_kvs_config *)auStack_1430);
  pfStack_1490 = (fdb_kvs_handle *)0x1172c5;
  fdb_begin_transaction((fdb_file_handle *)auStack_1458._24_8_,'\x03');
  pcVar11 = auStack_1318 + 0x50;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x1172ea;
    sprintf(pcVar11,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x1172f2;
    sVar3 = strlen(pcVar11);
    pfStack_1490 = (fdb_kvs_handle *)0x117310;
    fdb_doc_create((fdb_doc **)auStack_1478,pcVar11,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x11731f;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1458._32_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_1490 = (fdb_kvs_handle *)0x117ed9;
      transaction_test();
      goto LAB_00117ed9;
    }
    pfStack_1490 = (fdb_kvs_handle *)0x117331;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (int)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x117344;
  fdb_end_transaction((fdb_file_handle *)auStack_1458._24_8_,'\0');
  pfStack_1490 = (fdb_kvs_handle *)0x11734e;
  fdb_close((fdb_file_handle *)auStack_1458._24_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x11735a;
  fdb_end_transaction(pfStack_1460,'\0');
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x11737f;
    sprintf((char *)config,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x117387;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x1173a5;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x1173b4;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if ((uint)doc < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f7b;
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00117f80;
    pfStack_1490 = (fdb_kvs_handle *)0x1173d4;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (uint)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117400;
    sprintf((char *)config,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x117408;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117426;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117435;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1458._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117ed9;
    pfStack_1490 = (fdb_kvs_handle *)0x117447;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (int)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x117458;
  fdb_abort_transaction((fdb_file_handle *)auStack_1458._16_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x117465;
  fdb_close((fdb_file_handle *)auStack_1458._0_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x11747c;
  fdb_open((fdb_file_handle **)auStack_1458,"mvcc_test1",
           (fdb_config *)&fStack_11b8.config.encryption_key);
  pcVar11 = auStack_1478 + 8;
  pfStack_1490 = (fdb_kvs_handle *)0x117491;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1458._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_1430);
  pfStack_1490 = (fdb_kvs_handle *)0x1174a7;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1478._8_8_,logCallbackFunc,"transaction_test");
  pcVar21 = (char *)pfVar16;
  handle_00 = pfVar17;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f94;
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x1174d4;
    sprintf((char *)config,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x1174dc;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x1174fa;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117509;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if ((uint)doc < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f85;
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00117f8a;
    pfStack_1490 = (fdb_kvs_handle *)0x117529;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (uint)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  lVar10 = 0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117544;
    fdb_set((fdb_kvs_handle *)auStack_1478._8_8_,*(fdb_doc **)(auStack_1318 + lVar10 * 8 + 0x28));
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  pfStack_1490 = (fdb_kvs_handle *)0x117559;
  fdb_commit((fdb_file_handle *)auStack_1458._0_8_,'\0');
  pcVar11 = auStack_1318 + 0x50;
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x11757e;
    sprintf(pcVar11,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x117586;
    sVar3 = strlen(pcVar11);
    pfStack_1490 = (fdb_kvs_handle *)0x1175a4;
    fdb_doc_create((fdb_doc **)auStack_1478,pcVar11,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x1175b3;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117ede;
    pfStack_1490 = (fdb_kvs_handle *)0x1175c5;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (int)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x1175db;
  fdb_begin_transaction(pfStack_1460,'\x02');
  pfStack_1490 = (fdb_kvs_handle *)0x1175ea;
  fdb_begin_transaction((fdb_file_handle *)auStack_1458._16_8_,'\x02');
  uVar14 = 0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117609;
    sprintf(auStack_1318 + 0x50,"key%d",uVar14);
    doc = &fStack_11b8;
    pfStack_1490 = (fdb_kvs_handle *)0x117625;
    sprintf((char *)doc,"meta%d",uVar14);
    pcVar21 = auStack_1430 + 0x18;
    pfStack_1490 = (fdb_kvs_handle *)0x11763e;
    sprintf(pcVar21,"body%d_txn1",uVar14);
    pfStack_1490 = (fdb_kvs_handle *)0x117646;
    sVar3 = strlen(auStack_1318 + 0x50);
    pfStack_1490 = (fdb_kvs_handle *)0x117651;
    sVar4 = strlen((char *)doc);
    pfStack_1490 = (fdb_kvs_handle *)0x11765c;
    sVar5 = strlen(pcVar21);
    pcVar11 = auStack_1318 + 0x50;
    pfStack_1490 = (fdb_kvs_handle *)0x117681;
    fdb_doc_create((fdb_doc **)auStack_1478,pcVar11,sVar3,doc,sVar4,pcVar21,sVar5);
    pfStack_1490 = (fdb_kvs_handle *)0x117690;
    fdb_set(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
    pfStack_1490 = (fdb_kvs_handle *)0x11769a;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    pfStack_1490 = (fdb_kvs_handle *)0x1176ae;
    sprintf(pcVar21,"body%d_txn2",uVar14);
    pfStack_1490 = (fdb_kvs_handle *)0x1176b6;
    sVar3 = strlen(pcVar11);
    pfStack_1490 = (fdb_kvs_handle *)0x1176c1;
    sVar4 = strlen((char *)doc);
    pfStack_1490 = (fdb_kvs_handle *)0x1176cc;
    sVar5 = strlen(pcVar21);
    pfStack_1490 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_create((fdb_doc **)auStack_1478,pcVar11,sVar3,doc,sVar4,pcVar21,sVar5);
    pfStack_1490 = (fdb_kvs_handle *)0x1176f8;
    fdb_set((fdb_kvs_handle *)auStack_1458._8_8_,(fdb_doc *)auStack_1478._0_8_);
    pfStack_1490 = (fdb_kvs_handle *)0x117702;
    fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
    uVar9 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar9;
  } while (uVar9 != 10);
  pfVar17 = (fdb_kvs_handle *)auStack_1478;
  handle_00 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
    pfStack_1490 = (fdb_kvs_handle *)0x117736;
    sprintf((char *)config,"key%d",(ulong)pcVar11 & 0xffffffff);
    pfStack_1490 = (fdb_kvs_handle *)0x11773e;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x11775c;
    fdb_doc_create((fdb_doc **)pfVar17,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x11776b;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    pfVar16 = (fdb_kvs_handle *)auStack_1478._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117eee;
    doc = (fdb_kvs_handle *)
          ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
    pfVar8 = *(fdb_kvs_handle **)(*(long *)(auStack_1318 + (long)pcVar11 * 8) + 0x40);
    pfStack_1490 = (fdb_kvs_handle *)0x11779f;
    iVar2 = bcmp(doc,pfVar8,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    config = handle_00;
    if (iVar2 != 0) goto LAB_00117ee3;
    pfStack_1490 = (fdb_kvs_handle *)0x1177af;
    fdb_doc_free((fdb_doc *)pfVar16);
    pcVar21 = auStack_1318 + 0x50;
    pfStack_1490 = (fdb_kvs_handle *)0x1177bf;
    sVar3 = strlen(pcVar21);
    pfStack_1490 = (fdb_kvs_handle *)0x1177e0;
    fdb_doc_create((fdb_doc **)pfVar17,pcVar21,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x1177ef;
    fVar1 = fdb_get(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
    pfVar16 = pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f00;
    pfStack_1490 = (fdb_kvs_handle *)0x11780d;
    sprintf((char *)handle_00,"body%d_txn1",(ulong)pcVar11 & 0xffffffff);
    pcVar21 = (char *)auStack_1478._0_8_;
    doc = (fdb_kvs_handle *)
          ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
    pfStack_1490 = (fdb_kvs_handle *)0x117827;
    iVar2 = bcmp(doc,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00117ef3;
    pfStack_1490 = (fdb_kvs_handle *)0x117837;
    fdb_doc_free((fdb_doc *)pcVar21);
    config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
    pfStack_1490 = (fdb_kvs_handle *)0x117847;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117865;
    fdb_doc_create((fdb_doc **)pfVar17,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117874;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1458._8_8_,(fdb_doc *)auStack_1478._0_8_);
    pfVar8 = pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f12;
    pfStack_1490 = (fdb_kvs_handle *)0x11788f;
    sprintf((char *)handle_00,"body%d_txn2",(ulong)pcVar11 & 0xffffffff);
    pcVar21 = (char *)auStack_1478._0_8_;
    doc = (fdb_kvs_handle *)
          ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
    pfStack_1490 = (fdb_kvs_handle *)0x1178a9;
    iVar2 = bcmp(doc,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00117f05;
    pfStack_1490 = (fdb_kvs_handle *)0x1178b9;
    fdb_doc_free((fdb_doc *)pcVar21);
    pcVar11 = &(((fdb_kvs_handle *)pcVar11)->kvs_config).field_0x1;
  } while (pcVar11 != (undefined1 *)0xa);
  pfStack_1490 = (fdb_kvs_handle *)0x1178d2;
  fdb_end_transaction((fdb_file_handle *)auStack_1458._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  handle_00 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x1178f9;
    sprintf((char *)config,"key%d",pcVar11);
    pfStack_1490 = (fdb_kvs_handle *)0x117901;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x11791f;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x11792e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f24;
    pfStack_1490 = (fdb_kvs_handle *)0x117949;
    sprintf((char *)handle_00,"body%d_txn2",pcVar11);
    pcVar21 = (char *)auStack_1478._0_8_;
    doc = (fdb_kvs_handle *)
          ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
    pfStack_1490 = (fdb_kvs_handle *)0x117963;
    iVar2 = bcmp(doc,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00117f17;
    pfStack_1490 = (fdb_kvs_handle *)0x117973;
    fdb_doc_free((fdb_doc *)pcVar21);
    pfStack_1490 = (fdb_kvs_handle *)0x11797b;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117999;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x1179a8;
    fVar1 = fdb_get(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f36;
    pfStack_1490 = (fdb_kvs_handle *)0x1179c3;
    sprintf((char *)handle_00,"body%d_txn1",pcVar11);
    pcVar21 = (char *)auStack_1478._0_8_;
    doc = (fdb_kvs_handle *)
          ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
    pfStack_1490 = (fdb_kvs_handle *)0x1179dd;
    iVar2 = bcmp(doc,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00117f29;
    pfStack_1490 = (fdb_kvs_handle *)0x1179ed;
    fdb_doc_free((fdb_doc *)pcVar21);
    uVar9 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x117a04;
  fdb_end_transaction(pfStack_1460,'\0');
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pcVar21 = "body%d_txn1";
  handle_00 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
  doc = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117a2d;
    sprintf((char *)config,"key%d",doc);
    pfStack_1490 = (fdb_kvs_handle *)0x117a35;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117a55;
    fdb_doc_create((fdb_doc **)auStack_1478,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117a64;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f48;
    pfStack_1490 = (fdb_kvs_handle *)0x117a7b;
    sprintf((char *)handle_00,"body%d_txn1",doc);
    pcVar11 = (char *)auStack_1478._0_8_;
    pfVar8 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree
    ;
    pfStack_1490 = (fdb_kvs_handle *)0x117a93;
    iVar2 = bcmp(pfVar8,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00117f3b;
    pfStack_1490 = (fdb_kvs_handle *)0x117aa3;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar9 = (int)doc + 1;
    doc = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x117abd;
  fdb_begin_transaction(pfStack_1460,'\x02');
  pfVar17 = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfStack_1490 = (fdb_kvs_handle *)0x117adb;
  sprintf((char *)pfVar17,"key%d",5);
  pfVar8 = &fStack_11b8;
  pfStack_1490 = (fdb_kvs_handle *)0x117af9;
  sprintf((char *)pfVar8,"meta%d",5);
  pcVar21 = auStack_1430 + 0x18;
  pfStack_1490 = (fdb_kvs_handle *)0x117b14;
  sprintf(pcVar21,"body%d_before_compaction",5);
  pfStack_1490 = (fdb_kvs_handle *)0x117b1c;
  handle_00 = (fdb_kvs_handle *)strlen((char *)pfVar17);
  pfStack_1490 = (fdb_kvs_handle *)0x117b27;
  doc = (fdb_kvs_handle *)strlen((char *)pfVar8);
  pfStack_1490 = (fdb_kvs_handle *)0x117b32;
  sVar3 = strlen(pcVar21);
  config = (fdb_kvs_handle *)auStack_1478;
  pfStack_1490 = (fdb_kvs_handle *)0x117b52;
  fdb_doc_create((fdb_doc **)config,pfVar17,(size_t)handle_00,pfVar8,(size_t)doc,pcVar21,sVar3);
  pfStack_1490 = (fdb_kvs_handle *)0x117b5f;
  fdb_set(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x117b67;
  fdb_doc_free((fdb_doc *)auStack_1478._0_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x117b78;
  fdb_compact((fdb_file_handle *)auStack_1458._0_8_,"mvcc_test2");
  pfStack_1490 = (fdb_kvs_handle *)0x117b80;
  sVar3 = strlen((char *)pfVar17);
  pfStack_1490 = (fdb_kvs_handle *)0x117b9e;
  fdb_doc_create((fdb_doc **)config,pfVar17,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_1490 = (fdb_kvs_handle *)0x117bab;
  fVar1 = fdb_get(pfStack_1468,(fdb_doc *)auStack_1478._0_8_);
  pcVar11 = (char *)auStack_1478._0_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f99;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
  pfStack_1490 = (fdb_kvs_handle *)0x117bcd;
  iVar2 = bcmp(config,auStack_1430 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
  if (iVar2 != 0) goto LAB_00117f9e;
  pfStack_1490 = (fdb_kvs_handle *)0x117bdd;
  fdb_doc_free((fdb_doc *)pcVar11);
  pcVar11 = auStack_1318 + 0x50;
  pfStack_1490 = (fdb_kvs_handle *)0x117bed;
  sVar3 = strlen(pcVar11);
  config = (fdb_kvs_handle *)auStack_1478;
  pfStack_1490 = (fdb_kvs_handle *)0x117c10;
  fdb_doc_create((fdb_doc **)config,pcVar11,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_1490 = (fdb_kvs_handle *)0x117c1d;
  fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117fab;
  pfVar8 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
  pfStack_1490 = (fdb_kvs_handle *)0x117c40;
  sprintf((char *)pfVar8,"body%d_txn1",5);
  pcVar11 = (char *)auStack_1478._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))->seqtree;
  pfStack_1490 = (fdb_kvs_handle *)0x117c58;
  iVar2 = bcmp(config,pfVar8,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
  if (iVar2 != 0) goto LAB_00117fb0;
  pfStack_1490 = (fdb_kvs_handle *)0x117c68;
  fdb_doc_free((fdb_doc *)pcVar11);
  pfStack_1490 = (fdb_kvs_handle *)0x117c74;
  fdb_end_transaction(pfStack_1460,'\0');
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  handle_00 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
  pcVar21 = (char *)0x0;
  do {
    pfStack_1490 = (fdb_kvs_handle *)0x117c9d;
    sprintf((char *)config,"key%d",pcVar21);
    pfStack_1490 = (fdb_kvs_handle *)0x117ca5;
    sVar3 = strlen((char *)config);
    pfStack_1490 = (fdb_kvs_handle *)0x117cc3;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_1490 = (fdb_kvs_handle *)0x117cd2;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117f5a;
    if ((int)pcVar21 == 5) {
      pcVar11 = "body%d_before_compaction";
      pfVar17 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar11 = "body%d_txn1";
      pfVar17 = (fdb_kvs_handle *)pcVar21;
    }
    pfStack_1490 = (fdb_kvs_handle *)0x117d02;
    sprintf((char *)handle_00,pcVar11,pfVar17);
    doc = (fdb_kvs_handle *)auStack_1478._0_8_;
    pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1478._0_8_ + 0x40))
                      ->seqtree;
    pfStack_1490 = (fdb_kvs_handle *)0x117d1a;
    iVar2 = bcmp(pcVar11,handle_00,(size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param)
    ;
    if (iVar2 != 0) goto LAB_00117f4d;
    pfStack_1490 = (fdb_kvs_handle *)0x117d2a;
    fdb_doc_free((fdb_doc *)doc);
    uVar9 = (int)pcVar21 + 1;
    pcVar21 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_1490 = (fdb_kvs_handle *)0x117d44;
  fdb_close((fdb_file_handle *)auStack_1458._0_8_);
  pfStack_1490 = (fdb_kvs_handle *)0x117d5b;
  fdb_open((fdb_file_handle **)auStack_1458,"mvcc_test2",
           (fdb_config *)&fStack_11b8.config.encryption_key);
  pcVar11 = auStack_1478 + 8;
  pfStack_1490 = (fdb_kvs_handle *)0x117d70;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1458._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_1430);
  pfStack_1490 = (fdb_kvs_handle *)0x117d86;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1478._8_8_,logCallbackFunc,"transaction_test");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
    pfVar8 = (fdb_kvs_handle *)auStack_1478;
    handle_00 = (fdb_kvs_handle *)(auStack_1430 + 0x18);
    pcVar21 = (char *)0x0;
    while( true ) {
      pfStack_1490 = (fdb_kvs_handle *)0x117db7;
      sprintf((char *)config,"key%d",pcVar21);
      pfStack_1490 = (fdb_kvs_handle *)0x117dbf;
      sVar3 = strlen((char *)config);
      pfStack_1490 = (fdb_kvs_handle *)0x117ddd;
      fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
      pfStack_1490 = (fdb_kvs_handle *)0x117dec;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_1478._8_8_,(fdb_doc *)auStack_1478._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar21 == 5) {
        pcVar11 = "body%d_before_compaction";
        pfVar17 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar11 = "body%d_txn1";
        pfVar17 = (fdb_kvs_handle *)pcVar21;
      }
      pfStack_1490 = (fdb_kvs_handle *)0x117e1c;
      sprintf((char *)handle_00,pcVar11,pfVar17);
      doc = (fdb_kvs_handle *)auStack_1478._0_8_;
      pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                        (auStack_1478._0_8_ + 0x40))->seqtree;
      pfStack_1490 = (fdb_kvs_handle *)0x117e34;
      iVar2 = bcmp(pcVar11,handle_00,
                   (size_t)((fdb_kvs_config *)auStack_1478._0_8_)->custom_cmp_param);
      if (iVar2 != 0) goto LAB_00117f5f;
      pfStack_1490 = (fdb_kvs_handle *)0x117e44;
      fdb_doc_free((fdb_doc *)doc);
      uVar9 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar9;
      if (uVar9 == 10) {
        pfStack_1490 = (fdb_kvs_handle *)0x117e5b;
        fdb_close((fdb_file_handle *)auStack_1458._0_8_);
        pfStack_1490 = (fdb_kvs_handle *)0x117e65;
        fdb_close(pfStack_1460);
        pfStack_1490 = (fdb_kvs_handle *)0x117e6f;
        fdb_close((fdb_file_handle *)auStack_1458._16_8_);
        lVar10 = 0;
        do {
          pfStack_1490 = (fdb_kvs_handle *)0x117e7e;
          fdb_doc_free(*(fdb_doc **)(auStack_1318 + lVar10 * 8));
          lVar10 = lVar10 + 1;
        } while (lVar10 != 10);
        pfStack_1490 = (fdb_kvs_handle *)0x117e8c;
        fdb_shutdown();
        pfStack_1490 = (fdb_kvs_handle *)0x117e91;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_1490 = (fdb_kvs_handle *)0x117ec2;
        fprintf(_stderr,pcVar11,"transaction test");
        return;
      }
    }
    goto LAB_00117f6c;
  }
  goto LAB_00117fbd;
LAB_001185e9:
  pfStack_1828 = (fdb_kvs_handle *)0x1185f6;
  transaction_simple_api_test();
  pfVar16 = pfVar17;
LAB_001185f6:
  pfStack_1828 = (fdb_kvs_handle *)0x1185fb;
  transaction_simple_api_test();
LAB_001185fb:
  pfStack_1828 = (fdb_kvs_handle *)0x118608;
  transaction_simple_api_test();
  pfVar17 = pfVar16;
LAB_00118608:
  pfStack_1828 = (fdb_kvs_handle *)0x11860d;
  transaction_simple_api_test();
LAB_0011860d:
  pfStack_1828 = (fdb_kvs_handle *)0x11861a;
  transaction_simple_api_test();
  pfVar8 = pfVar17;
LAB_0011861a:
  pfStack_1828 = (fdb_kvs_handle *)0x11861f;
  transaction_simple_api_test();
LAB_0011861f:
  pfStack_1828 = (fdb_kvs_handle *)0x11862c;
  transaction_simple_api_test();
  pfVar17 = pfVar8;
LAB_0011862c:
  pfVar8 = pfVar17;
  pfStack_1828 = (fdb_kvs_handle *)0x118631;
  transaction_simple_api_test();
LAB_00118631:
  pfStack_1828 = (fdb_kvs_handle *)0x118636;
  transaction_simple_api_test();
LAB_00118636:
  pfVar16 = pfVar8;
  pfStack_1828 = (fdb_kvs_handle *)0x11863b;
  transaction_simple_api_test();
LAB_0011863b:
  pfStack_1828 = (fdb_kvs_handle *)0x118648;
  transaction_simple_api_test();
LAB_00118648:
  pfVar8 = (fdb_kvs_handle *)auStack_17b0;
  pfStack_1828 = (fdb_kvs_handle *)0x118655;
  transaction_simple_api_test();
  pfVar17 = (fdb_kvs_handle *)pcVar21;
  goto LAB_00118655;
LAB_00117ed9:
  pfStack_1490 = (fdb_kvs_handle *)0x117ede;
  transaction_test();
LAB_00117ede:
  pfVar8 = (fdb_kvs_handle *)auStack_1478;
  config = (fdb_kvs_handle *)(auStack_1318 + 0x50);
  pcVar11 = "key%d";
  pfStack_1490 = (fdb_kvs_handle *)0x117ee3;
  transaction_test();
LAB_00117ee3:
  pfStack_1490 = (fdb_kvs_handle *)0x117eee;
  transaction_test();
  pcVar21 = (char *)pfVar16;
  handle_00 = pfVar17;
  pfVar17 = pfVar8;
LAB_00117eee:
  pfStack_1490 = (fdb_kvs_handle *)0x117ef3;
  transaction_test();
LAB_00117ef3:
  pfStack_1490 = (fdb_kvs_handle *)0x117f00;
  transaction_test();
  pfVar16 = handle_00;
LAB_00117f00:
  handle_00 = pfVar16;
  pfStack_1490 = (fdb_kvs_handle *)0x117f05;
  transaction_test();
  pfVar8 = pfVar17;
LAB_00117f05:
  pfStack_1490 = (fdb_kvs_handle *)0x117f12;
  transaction_test();
LAB_00117f12:
  pfStack_1490 = (fdb_kvs_handle *)0x117f17;
  transaction_test();
LAB_00117f17:
  pfStack_1490 = (fdb_kvs_handle *)0x117f24;
  transaction_test();
LAB_00117f24:
  pfStack_1490 = (fdb_kvs_handle *)0x117f29;
  transaction_test();
LAB_00117f29:
  pfStack_1490 = (fdb_kvs_handle *)0x117f36;
  transaction_test();
LAB_00117f36:
  pfStack_1490 = (fdb_kvs_handle *)0x117f3b;
  transaction_test();
LAB_00117f3b:
  pfStack_1490 = (fdb_kvs_handle *)0x117f48;
  transaction_test();
LAB_00117f48:
  pfStack_1490 = (fdb_kvs_handle *)0x117f4d;
  transaction_test();
LAB_00117f4d:
  pfStack_1490 = (fdb_kvs_handle *)0x117f5a;
  transaction_test();
LAB_00117f5a:
  pfStack_1490 = (fdb_kvs_handle *)0x117f5f;
  transaction_test();
LAB_00117f5f:
  pfStack_1490 = (fdb_kvs_handle *)0x117f6c;
  transaction_test();
LAB_00117f6c:
  pfStack_1490 = (fdb_kvs_handle *)0x117f71;
  transaction_test();
  pfVar16 = (fdb_kvs_handle *)pcVar21;
  pfVar17 = handle_00;
LAB_00117f71:
  pfStack_1490 = (fdb_kvs_handle *)0x117f76;
  transaction_test();
LAB_00117f76:
  pfStack_1490 = (fdb_kvs_handle *)0x117f7b;
  transaction_test();
LAB_00117f7b:
  pfStack_1490 = (fdb_kvs_handle *)0x117f80;
  transaction_test();
LAB_00117f80:
  pfStack_1490 = (fdb_kvs_handle *)0x117f85;
  transaction_test();
LAB_00117f85:
  pfStack_1490 = (fdb_kvs_handle *)0x117f8a;
  transaction_test();
LAB_00117f8a:
  pfStack_1490 = (fdb_kvs_handle *)0x117f8f;
  transaction_test();
LAB_00117f8f:
  pfStack_1490 = (fdb_kvs_handle *)0x117f94;
  transaction_test();
  pcVar21 = (char *)pfVar16;
  handle_00 = pfVar17;
LAB_00117f94:
  pfStack_1490 = (fdb_kvs_handle *)0x117f99;
  transaction_test();
  pfVar17 = (fdb_kvs_handle *)pcVar11;
LAB_00117f99:
  pcVar11 = (char *)pfVar17;
  pfStack_1490 = (fdb_kvs_handle *)0x117f9e;
  transaction_test();
LAB_00117f9e:
  pfStack_1490 = (fdb_kvs_handle *)0x117fab;
  transaction_test();
LAB_00117fab:
  pfStack_1490 = (fdb_kvs_handle *)0x117fb0;
  transaction_test();
LAB_00117fb0:
  pfStack_1490 = (fdb_kvs_handle *)0x117fbd;
  transaction_test();
LAB_00117fbd:
  pfStack_1490 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_1828 = (fdb_kvs_handle *)0x117fdf;
  pfStack_14b8 = (fdb_kvs_handle *)pcVar11;
  pfStack_14b0 = (fdb_kvs_handle *)pcVar21;
  pfStack_14a8 = handle_00;
  pfStack_14a0 = config;
  pfStack_1498 = pfVar8;
  pfStack_1490 = doc;
  gettimeofday(&tStack_17c0,(__timezone_ptr_t)0x0);
  pfStack_1828 = (fdb_kvs_handle *)0x117fe4;
  memleak_start();
  pfStack_1828 = (fdb_kvs_handle *)0x117ff0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1828 = (fdb_kvs_handle *)0x118000;
  fdb_get_default_config();
  config_00 = &fStack_17d8;
  pfStack_1828 = (fdb_kvs_handle *)0x11800d;
  fdb_get_default_kvs_config();
  fStack_15b0.buffercache_size = 0;
  fStack_15b0.wal_threshold = 0x400;
  fStack_15b0.flags = 1;
  fStack_15b0.purging_interval = 0;
  fStack_15b0.compaction_threshold = '\0';
  pfVar17 = (fdb_kvs_handle *)&phStack_17e0;
  pfStack_1828 = (fdb_kvs_handle *)0x118046;
  fdb_open((fdb_file_handle **)pfVar17,"./mvcc_test1",&fStack_15b0);
  pfVar16 = (fdb_kvs_handle *)&pfStack_1808;
  pfStack_1828 = (fdb_kvs_handle *)0x118059;
  fdb_kvs_open_default((fdb_file_handle *)phStack_17e0,(fdb_kvs_handle **)pfVar16,config_00);
  pfStack_1828 = (fdb_kvs_handle *)0x11806f;
  pfVar8 = pfStack_1808;
  fVar1 = fdb_set_log_callback(pfStack_1808,logCallbackFunc,"transaction_simple_api_test");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar11 = auStack_17b0 + 0x100;
    pcVar21 = "body%d";
    doc = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1828 = (fdb_kvs_handle *)0x1180a0;
      sprintf(pcVar11,"key%d",doc);
      pfStack_1828 = (fdb_kvs_handle *)0x1180af;
      sprintf(auStack_17b0,"body%d",doc);
      handle_00 = pfStack_1808;
      pfStack_1828 = (fdb_kvs_handle *)0x1180bc;
      pfVar17 = (fdb_kvs_handle *)strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x1180c7;
      sVar3 = strlen(auStack_17b0);
      pfStack_1828 = (fdb_kvs_handle *)0x1180db;
      fVar1 = fdb_set_kv(handle_00,pcVar11,(size_t)pfVar17,auStack_17b0,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_1828 = (fdb_kvs_handle *)0x1185e9;
        transaction_simple_api_test();
        goto LAB_001185e9;
      }
      uVar9 = (int)doc + 1;
      doc = (fdb_kvs_handle *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_1828 = (fdb_kvs_handle *)0x1180f6;
    fdb_commit((fdb_file_handle *)phStack_17e0,'\0');
    pfStack_1828 = (fdb_kvs_handle *)0x118118;
    fdb_open((fdb_file_handle **)&phStack_17e8,"./mvcc_test1",&fStack_15b0);
    pfStack_1828 = (fdb_kvs_handle *)0x11812b;
    fdb_open((fdb_file_handle **)&pkStack_17f0,"./mvcc_test1",&fStack_15b0);
    pfStack_1828 = (fdb_kvs_handle *)0x118140;
    fdb_kvs_open_default((fdb_file_handle *)phStack_17e8,&pfStack_17f8,&fStack_17d8);
    pfStack_1828 = (fdb_kvs_handle *)0x118151;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_17f0,&pfStack_1800,&fStack_17d8);
    pfStack_1828 = (fdb_kvs_handle *)0x11815e;
    fdb_begin_transaction((fdb_file_handle *)phStack_17e8,'\x02');
    pfStack_1828 = (fdb_kvs_handle *)0x11816c;
    fdb_begin_transaction((fdb_file_handle *)pkStack_17f0,'\x02');
    pcVar11 = auStack_17b0 + 0x100;
    uVar9 = 0;
    do {
      pfStack_1828 = (fdb_kvs_handle *)0x118191;
      sprintf(pcVar11,"key%d",(ulong)uVar9);
      pfStack_1828 = (fdb_kvs_handle *)0x1181a4;
      sprintf(auStack_17b0,"body%d_txn1",(ulong)uVar9);
      pfVar17 = pfStack_17f8;
      pfStack_1828 = (fdb_kvs_handle *)0x1181b1;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x1181bc;
      sVar4 = strlen(auStack_17b0);
      pfStack_1828 = (fdb_kvs_handle *)0x1181d0;
      fdb_set_kv(pfVar17,pcVar11,sVar3,auStack_17b0,sVar4);
      pfStack_1828 = (fdb_kvs_handle *)0x1181df;
      sprintf(pcVar11,"key%d",(ulong)uVar9);
      pfStack_1828 = (fdb_kvs_handle *)0x1181f2;
      sprintf(auStack_17b0,"body%d_txn2",(ulong)uVar9);
      pfVar17 = pfStack_1800;
      pfStack_1828 = (fdb_kvs_handle *)0x1181ff;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x11820a;
      sVar4 = strlen(auStack_17b0);
      pfStack_1828 = (fdb_kvs_handle *)0x11821e;
      fdb_set_kv(pfVar17,pcVar11,sVar3,auStack_17b0,sVar4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
    pcVar11 = auStack_17b0 + 0x100;
    handle_00 = (fdb_kvs_handle *)&pfStack_1818;
    doc = (fdb_kvs_handle *)&p_Stack_1810;
    pcVar21 = (char *)0x0;
    do {
      pfStack_1828 = (fdb_kvs_handle *)0x118257;
      sprintf(pcVar11,"key%d",pcVar21);
      pfStack_1828 = (fdb_kvs_handle *)0x11826b;
      sprintf(auStack_17b0,"body%d",pcVar21);
      pfVar16 = pfStack_1808;
      pfStack_1828 = (fdb_kvs_handle *)0x118278;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x11828c;
      fVar1 = fdb_get_kv(pfVar16,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pfVar17 = pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001185f6;
      pfStack_1828 = (fdb_kvs_handle *)0x1182a9;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_001185e9;
      pfStack_1828 = (fdb_kvs_handle *)0x1182b9;
      fdb_free_block(pfVar17);
      pfStack_1828 = (fdb_kvs_handle *)0x1182cd;
      sprintf(pcVar11,"key%d",pcVar21);
      pfStack_1828 = (fdb_kvs_handle *)0x1182e1;
      sprintf(auStack_17b0,"body%d_txn1",pcVar21);
      pfVar17 = pfStack_17f8;
      pfStack_1828 = (fdb_kvs_handle *)0x1182ee;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x118302;
      fVar1 = fdb_get_kv(pfVar17,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pfVar16 = pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00118608;
      pfStack_1828 = (fdb_kvs_handle *)0x11831f;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_001185fb;
      pfStack_1828 = (fdb_kvs_handle *)0x11832f;
      fdb_free_block(pfVar16);
      pfStack_1828 = (fdb_kvs_handle *)0x118343;
      sprintf(pcVar11,"key%d",pcVar21);
      pfStack_1828 = (fdb_kvs_handle *)0x118357;
      sprintf(auStack_17b0,"body%d_txn2",pcVar21);
      pfVar8 = pfStack_1800;
      pfStack_1828 = (fdb_kvs_handle *)0x118364;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x118378;
      fVar1 = fdb_get_kv(pfVar8,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pfVar17 = pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011861a;
      pfStack_1828 = (fdb_kvs_handle *)0x118395;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_0011860d;
      pfStack_1828 = (fdb_kvs_handle *)0x1183a5;
      fdb_free_block(pfVar17);
      uVar9 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_1828 = (fdb_kvs_handle *)0x1183be;
    fdb_end_transaction((fdb_file_handle *)phStack_17e8,'\0');
    pcVar11 = auStack_17b0 + 0x100;
    handle_00 = (fdb_kvs_handle *)&pfStack_1818;
    doc = (fdb_kvs_handle *)&p_Stack_1810;
    pcVar21 = (char *)0x0;
    do {
      pfStack_1828 = (fdb_kvs_handle *)0x1183ec;
      sprintf(pcVar11,"key%d",pcVar21);
      pfStack_1828 = (fdb_kvs_handle *)0x118400;
      sprintf(auStack_17b0,"body%d_txn1",pcVar21);
      pfVar17 = pfStack_1808;
      pfStack_1828 = (fdb_kvs_handle *)0x11840d;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x118421;
      fVar1 = fdb_get_kv(pfVar17,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pfVar8 = pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011862c;
      pfStack_1828 = (fdb_kvs_handle *)0x11843e;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_0011861f;
      pfStack_1828 = (fdb_kvs_handle *)0x11844e;
      fVar1 = fdb_free_block(pfVar8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00118631;
      pfStack_1828 = (fdb_kvs_handle *)0x11846a;
      sprintf(pcVar11,"key%d",pcVar21);
      pfStack_1828 = (fdb_kvs_handle *)0x11847e;
      sprintf(auStack_17b0,"body%d_txn2",pcVar21);
      pfVar8 = pfStack_1800;
      pfStack_1828 = (fdb_kvs_handle *)0x11848b;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x11849f;
      fVar1 = fdb_get_kv(pfVar8,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pfVar16 = pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00118636;
      pfStack_1828 = (fdb_kvs_handle *)0x1184bc;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_0011863b;
      pfStack_1828 = (fdb_kvs_handle *)0x1184cc;
      fdb_free_block(pfVar16);
      uVar9 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_1828 = (fdb_kvs_handle *)0x1184e5;
    fdb_end_transaction((fdb_file_handle *)pkStack_17f0,'\0');
    pcVar11 = auStack_17b0 + 0x100;
    handle_00 = (fdb_kvs_handle *)&pfStack_1818;
    doc = (fdb_kvs_handle *)&p_Stack_1810;
    pfVar16 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_1828 = (fdb_kvs_handle *)0x118511;
      sprintf(pcVar11,"key%d",pfVar16);
      pfStack_1828 = (fdb_kvs_handle *)0x118524;
      sprintf(auStack_17b0,"body%d_txn2",pfVar16);
      pfVar17 = pfStack_1808;
      pfStack_1828 = (fdb_kvs_handle *)0x118531;
      sVar3 = strlen(pcVar11);
      pfStack_1828 = (fdb_kvs_handle *)0x118545;
      pfVar8 = pfVar17;
      fVar1 = fdb_get_kv(pfVar17,pcVar11,sVar3,(void **)handle_00,(size_t *)doc);
      pcVar21 = (char *)pfStack_1818;
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      pfStack_1828 = (fdb_kvs_handle *)0x118562;
      iVar2 = bcmp(pfStack_1818,auStack_17b0,(size_t)p_Stack_1810);
      if (iVar2 != 0) goto LAB_00118648;
      pfStack_1828 = (fdb_kvs_handle *)0x118572;
      fdb_free_block(pcVar21);
      uVar9 = (int)pfVar16 + 1;
      pfVar16 = (fdb_kvs_handle *)(ulong)uVar9;
      if (uVar9 == 10) {
        pfStack_1828 = (fdb_kvs_handle *)0x118583;
        fdb_close((fdb_file_handle *)phStack_17e0);
        pfStack_1828 = (fdb_kvs_handle *)0x11858d;
        fdb_close((fdb_file_handle *)phStack_17e8);
        pfStack_1828 = (fdb_kvs_handle *)0x118597;
        fdb_close((fdb_file_handle *)pkStack_17f0);
        pfStack_1828 = (fdb_kvs_handle *)0x11859c;
        fdb_shutdown();
        pfStack_1828 = (fdb_kvs_handle *)0x1185a1;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_1828 = (fdb_kvs_handle *)0x1185d2;
        fprintf(_stderr,pcVar11,"transaction simple API test");
        return;
      }
    }
LAB_00118655:
    config_00 = (fdb_kvs_config *)(auStack_17b0 + 0x100);
    pcVar21 = auStack_17b0;
    pfStack_1828 = (fdb_kvs_handle *)0x11865a;
    transaction_simple_api_test();
  }
  pfStack_1828 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_1850 = pfVar16;
  pfStack_1848 = (fdb_kvs_handle *)pcVar21;
  pfStack_1840 = handle_00;
  pfStack_1838 = config_00;
  pfStack_1830 = pfVar17;
  pfStack_1828 = doc;
  gettimeofday(&tStack_1a68,(__timezone_ptr_t)0x0);
  fVar1 = fdb_snapshot_open(pfVar8,&pfStack_1a70,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar1 = fdb_iterator_init(pfStack_1a70,&pfStack_1a80,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar14 = 0;
  do {
    uVar9 = (uint)uVar14;
    pfStack_1a78 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_get(pfStack_1a80,&pfStack_1a78);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_1958,"key%d",uVar14);
    sprintf(acStack_1a58,"body%d",uVar14);
    pfVar6 = pfStack_1a78;
    pvVar20 = pfStack_1a78->key;
    iVar2 = bcmp(pvVar20,acStack_1958,pfStack_1a78->keylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_1958,pvVar20,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar20 = pfVar6->body;
    iVar2 = bcmp(pvVar20,acStack_1a58,pfVar6->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_1a58,pvVar20,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar9 = uVar9 + 1;
    uVar14 = (ulong)uVar9;
    fdb_doc_free(pfVar6);
    fVar1 = fdb_iterator_next(pfStack_1a80);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  if (uVar9 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar1 = fdb_iterator_close(pfStack_1a80);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar1 = fdb_kvs_close(pfStack_1a70);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_forward_seqnum()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, n=100;
    int rb1_seqnum, rb2_seqnum;
    char keybuf[256];
    char setop[3];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n+1);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = n;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 5;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);


    // set n docs within both dbs
    for(i=0;i<=n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set_kv(mirror_kv1, keybuf, strlen(keybuf), setop, 3);
    } // last set should have caused a wal flush

    fdb_del(kv1, doc[n]);

    // commit and save seqnum1
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_get_kvs_info(kv1, &info);
    rb1_seqnum = info.last_seqnum;

    // delete all docs in kv1
    for(i=0;i<n;++i){
        fdb_del(kv1, doc[i]);
    }

    // commit and save seqnum2
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    rb2_seqnum = info.last_seqnum;

    // sets again
    for(i=0;i<n;++i){
        doc[i]->deleted = false;
        fdb_set(kv1, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // rollback to first seqnum
    status = fdb_rollback(&kv1, rb1_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.deleted_count == 1);

    // rollback to second seqnum
    status = fdb_rollback(&kv1, rb2_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (rdoc->seqnum != (uint64_t)n+1) {
            status = fdb_get_metaonly_byseq(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == false);
        } else {
            status = fdb_get_metaonly(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == true);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    for (i=0;i<=n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_iterator_close(it);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback forward seqnum");
}